

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O2

void __thiscall
cfd::core::ConfidentialAssetId::ConfidentialAssetId(ConfidentialAssetId *this,ByteData *byte_data)

{
  ByteData *this_00;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __last;
  uint8_t uVar1;
  size_t sVar2;
  CfdException *pCVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *bytes;
  undefined1 local_70 [32];
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  
  this->_vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_00276fd0;
  this_00 = &this->data_;
  ByteData::ByteData(this_00);
  this->version_ = '\0';
  sVar2 = ByteData::GetDataSize(byte_data);
  if (sVar2 == 0x20) {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,&byte_data->data_);
    this->version_ = '\x01';
    uVar1 = '\x01';
  }
  else {
    if (sVar2 != 0x21) {
      if (sVar2 == 0) {
        buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = "cfdcore_elements_transaction.cpp";
        buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish._0_4_ = 0x187;
        buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = "ConfidentialAssetId";
        ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_38,
                           byte_data);
        StringUtil::ByteToString_abi_cxx11_((string *)local_70,(StringUtil *)&local_38,bytes);
        logger::warn<std::__cxx11::string>
                  ((CfdSourceLocation *)&buffer,"Empty ConfidentialAssetId. byte_data={}.",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
        ::std::__cxx11::string::~string((string *)local_70);
        ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_38)
        ;
        pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::__cxx11::string::string
                  ((string *)local_70,"Empty AssetId is invalid.",(allocator *)&buffer);
        CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_70);
        __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
      }
      local_70._0_8_ = "cfdcore_elements_transaction.cpp";
      local_70._8_4_ = 0x19c;
      local_70._16_8_ = "ConfidentialAssetId";
      buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)ByteData::GetDataSize(byte_data);
      logger::warn<unsigned_long>
                ((CfdSourceLocation *)local_70,"AssetId size Invalid. size={}.",
                 (unsigned_long *)&buffer);
      pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)local_70,"AssetId size Invalid.",(allocator *)&buffer);
      CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_70);
      __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70,byte_data);
    __last._M_current._4_4_ = local_70._12_4_;
    __last._M_current._0_4_ = local_70._8_4_;
    ::std::vector<unsigned_char,std::allocator<unsigned_char>>::
    vector<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&buffer,
               (uchar *)(local_70._0_8_ + 1),__last,(allocator_type *)&local_38);
    uVar1 = *(uint8_t *)local_70._0_8_;
    this->version_ = uVar1;
    if (uVar1 != '\0') {
      ByteData::ByteData((ByteData *)&local_38,&buffer);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,&local_38);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_38);
    }
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_70);
    uVar1 = this->version_;
  }
  CheckVersion(uVar1);
  return;
}

Assistant:

ConfidentialAssetId::ConfidentialAssetId(const ByteData &byte_data)
    : data_(), version_(0) {
  switch (byte_data.GetDataSize()) {
    case 0:
      warn(
          CFD_LOG_SOURCE, "Empty ConfidentialAssetId. byte_data={}.",
          StringUtil::ByteToString(byte_data.GetBytes()));
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Empty AssetId is invalid.");
      break;
    case kAssetSize: {
      data_ = byte_data;
      version_ = kConfidentialVersion_1;
      break;
    }
    case kConfidentialDataSize: {
      const std::vector<uint8_t> &data = byte_data.GetBytes();
      std::vector<uint8_t> buffer(data.cbegin() + 1, data.cend());
      version_ = data[0];
      if (version_ != 0) {
        data_ = ByteData(buffer);
      }
      break;
    }
    default:
      warn(
          CFD_LOG_SOURCE, "AssetId size Invalid. size={}.",
          byte_data.GetDataSize());
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "AssetId size Invalid.");
  }
  CheckVersion(version_);
}